

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLoader.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::Loader::~Loader(Loader *this)

{
  _Base_ptr p_Var1;
  
  (this->super_ILoader)._vptr_ILoader = (_func_int **)&PTR__Loader_009538f0;
  if (this->mSidTreeRoot != (SidTreeNode *)0x0) {
    (*this->mSidTreeRoot->_vptr_SidTreeNode[1])();
  }
  deleteVectorFW<COLLADAFW::VisualScene*>(&this->mVisualScenes);
  deleteVectorFW<COLLADAFW::LibraryNodes*>(&this->mLibraryNodes);
  deleteVectorFW<COLLADAFW::Effect*>(&this->mEffects);
  deleteVectorFW<COLLADAFW::Light*>(&this->mLights);
  deleteVectorFW<COLLADAFW::Camera*>(&this->mCameras);
  for (p_Var1 = (this->mUniqueIdAnimationListMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->mUniqueIdAnimationListMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_right != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_right + 8))();
    }
  }
  std::
  vector<COLLADASaxFWL::Loader::AnimationSidAddressBinding,_std::allocator<COLLADASaxFWL::Loader::AnimationSidAddressBinding>_>
  ::~vector(&this->mAnimationSidAddressBindings);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
  ::~_Rb_tree(&(this->mFormulasMap)._M_t);
  KinematicsIntermediateData::~KinematicsIntermediateData(&this->mKinematicsIntermediateData);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
  ::~_Rb_tree(&(this->mUniqueIdAnimationListMap)._M_t);
  std::
  _Rb_tree<COLLADAFW::SkinController,_COLLADAFW::SkinController,_std::_Identity<COLLADAFW::SkinController>,_bool_(*)(const_COLLADAFW::SkinController_&,_const_COLLADAFW::SkinController_&),_std::allocator<COLLADAFW::SkinController>_>
  ::~_Rb_tree(&(this->mSkinControllerSet)._M_t);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>_>_>
  ::~_Rb_tree(&(this->mSkinDataSkinSourceMap)._M_t);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>_>_>
  ::~_Rb_tree(&(this->mInstanceControllerDataListMap)._M_t);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>_>_>
  ::~_Rb_tree(&(this->mSkinDataJointSidsMap)._M_t);
  std::_Vector_base<COLLADAFW::MorphController_*,_std::allocator<COLLADAFW::MorphController_*>_>::
  ~_Vector_base(&(this->mMorphControllerList).
                 super__Vector_base<COLLADAFW::MorphController_*,_std::allocator<COLLADAFW::MorphController_*>_>
               );
  std::_Vector_base<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_>::~_Vector_base
            (&(this->mCameras).
              super__Vector_base<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_>);
  std::_Vector_base<COLLADAFW::Light_*,_std::allocator<COLLADAFW::Light_*>_>::~_Vector_base
            (&(this->mLights).
              super__Vector_base<COLLADAFW::Light_*,_std::allocator<COLLADAFW::Light_*>_>);
  std::_Vector_base<COLLADAFW::Effect_*,_std::allocator<COLLADAFW::Effect_*>_>::~_Vector_base
            (&(this->mEffects).
              super__Vector_base<COLLADAFW::Effect_*,_std::allocator<COLLADAFW::Effect_*>_>);
  std::_Vector_base<COLLADAFW::LibraryNodes_*,_std::allocator<COLLADAFW::LibraryNodes_*>_>::
  ~_Vector_base(&(this->mLibraryNodes).
                 super__Vector_base<COLLADAFW::LibraryNodes_*,_std::allocator<COLLADAFW::LibraryNodes_*>_>
               );
  std::_Vector_base<COLLADAFW::VisualScene_*,_std::allocator<COLLADAFW::VisualScene_*>_>::
  ~_Vector_base(&(this->mVisualScenes).
                 super__Vector_base<COLLADAFW::VisualScene_*,_std::allocator<COLLADAFW::VisualScene_*>_>
               );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>_>
  ::~_Rb_tree(&(this->mIdStringSidTreeNodeMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mTextureMapSemanticTextureMapIdMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mGeometryMaterialIdInfo).mColladaSymbolMaterialIdMap._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_COLLADABU::URI>,_std::_Select1st<std::pair<const_unsigned_long,_COLLADABU::URI>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_COLLADABU::URI>_>_>
  ::~_Rb_tree(&(this->mFileIdURIMap)._M_t);
  std::tr1::
  _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_unsigned_long>,_std::allocator<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::~_Hashtable((_Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_unsigned_long>,_std::allocator<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 *)&this->mURIFileIdMap);
  std::tr1::
  _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::~_Hashtable((_Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 *)&this->mURIUniqueIdMap);
  std::
  _Vector_base<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
  ::~_Vector_base(&(this->mExtraDataCallbackHandlerList).
                   super__Vector_base<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
                 );
  COLLADAFW::LoaderUtils::~LoaderUtils(&this->mLoaderUtil);
  return;
}

Assistant:

Loader::~Loader()
	{
		delete mSidTreeRoot;

		// delete visual scenes
		deleteVectorFW(mVisualScenes);

		// delete library nodes
		deleteVectorFW(mLibraryNodes);

		// delete effects
		deleteVectorFW(mEffects);

		// delete lights
		deleteVectorFW(mLights);

		// delete cameras
		deleteVectorFW(mCameras);

		// We do not delete formulas here. They are deleted by the Formulas class

		// delete animation lists
		Loader::UniqueIdAnimationListMap::const_iterator it = mUniqueIdAnimationListMap.begin();
		for ( ; it != mUniqueIdAnimationListMap.end(); ++it )
		{
			COLLADAFW::AnimationList* animationList = it->second;
			FW_DELETE animationList;
		}
	}